

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

CURLcode Curl_doh_is_resolved(connectdata *conn,Curl_dns_entry **dnsp)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  Curl_easy *data;
  Curl_easy *data_00;
  undefined8 uVar4;
  DOHcode DVar5;
  DOHcode DVar6;
  size_t sVar7;
  long lVar8;
  Curl_addrinfo *pCVar9;
  sockaddr *psVar10;
  Curl_dns_entry *pCVar11;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  CURLcode CVar15;
  uchar *puVar16;
  Curl_addrinfo *pCVar17;
  anon_union_16_2_f9ece763_for_ip *paVar18;
  ulong uVar19;
  size_t maxlength;
  curl_socklen_t cVar20;
  char *pcVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  dohentry de;
  Curl_addrinfo *local_330;
  dohentry local_308;
  char local_b8 [10];
  char local_ae [126];
  
  data = conn->data;
  *dnsp = (Curl_dns_entry *)0x0;
  data_00 = (data->req).doh.probe[0].easy;
  if ((data_00 == (Curl_easy *)0x0) && ((data->req).doh.probe[1].easy == (CURL_conflict *)0x0)) {
    Curl_failf(data,"Could not DOH-resolve: %s",(conn->async).hostname);
    CVar15 = (((conn->bits).field_0x4 & 0x10) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    CVar15 = CURLE_OK;
    if ((data->req).doh.pending == 0) {
      curl_multi_remove_handle(data->multi,data_00);
      Curl_close((data->req).doh.probe[0].easy);
      curl_multi_remove_handle(data->multi,(data->req).doh.probe[1].easy);
      Curl_close((data->req).doh.probe[1].easy);
      memset(&local_308,0,0x250);
      local_308.ttl = 0x7fffffff;
      DVar5 = doh_decode((data->req).doh.probe[0].serverdoh.memory,
                         (data->req).doh.probe[0].serverdoh.size,(data->req).doh.probe[0].dnstype,
                         &local_308);
      (*Curl_cfree)((data->req).doh.probe[0].serverdoh.memory);
      if (DVar5 != DOH_OK) {
        if (DVar5 < (DOH_DNS_BAD_ID|DOH_DNS_BAD_LABEL)) {
          pcVar21 = errors[DVar5];
        }
        else {
          pcVar21 = "bad error code";
        }
        pcVar13 = "AAAA";
        if ((data->req).doh.probe[0].dnstype == 1) {
          pcVar13 = "A";
        }
        Curl_infof(data,"DOH: %s type %s for %s\n",pcVar21,pcVar13,(data->req).doh.host);
      }
      DVar6 = doh_decode((data->req).doh.probe[1].serverdoh.memory,
                         (data->req).doh.probe[1].serverdoh.size,(data->req).doh.probe[1].dnstype,
                         &local_308);
      (*Curl_cfree)((data->req).doh.probe[1].serverdoh.memory);
      if (DVar6 != DOH_OK) {
        if (DVar6 < (DOH_DNS_BAD_ID|DOH_DNS_BAD_LABEL)) {
          pcVar21 = errors[DVar6];
        }
        else {
          pcVar21 = "bad error code";
        }
        pcVar13 = "AAAA";
        if ((data->req).doh.probe[1].dnstype == 1) {
          pcVar13 = "A";
        }
        Curl_infof(data,"DOH: %s type %s for %s\n",pcVar21,pcVar13,(data->req).doh.host);
      }
      if (DVar5 == DOH_OK || DVar6 == DOH_OK) {
        Curl_infof(data,"DOH Host name: %s\n",(data->req).doh.host);
        Curl_infof(data,"TTL: %u seconds\n",(ulong)local_308.ttl);
        uVar14 = (ulong)local_308.numaddr;
        if (0 < (long)uVar14) {
          puVar16 = local_308.addr[0].ip.v4 + 1;
          uVar19 = 0;
          do {
            iVar2 = local_308.addr[uVar19].type;
            if (iVar2 == 0x1c) {
              curl_msnprintf(local_b8,0x80,"DOH AAAA: ");
              maxlength = 0x76;
              uVar22 = 0xfffffffffffffffe;
              pcVar21 = local_ae;
              do {
                pcVar13 = ":";
                if (uVar22 == 0xfffffffffffffffe) {
                  pcVar13 = "";
                }
                curl_msnprintf(pcVar21,maxlength,"%s%02x%02x",pcVar13,(ulong)puVar16[uVar22 + 1],
                               (ulong)puVar16[uVar22 + 2]);
                sVar7 = strlen(pcVar21);
                maxlength = maxlength - sVar7;
                pcVar21 = pcVar21 + sVar7;
                uVar22 = uVar22 + 2;
              } while (uVar22 < 0xe);
              Curl_infof(data,"%s\n",local_b8);
            }
            else if (iVar2 == 1) {
              Curl_infof(data,"DOH A: %u.%u.%u.%u\n",(ulong)local_308.addr[uVar19].ip.v4[0],
                         (ulong)local_308.addr[uVar19].ip.v4[1],
                         (ulong)local_308.addr[uVar19].ip.v4[2],
                         (ulong)local_308.addr[uVar19].ip.v4[3]);
            }
            uVar19 = uVar19 + 1;
            puVar16 = puVar16 + 0x14;
          } while (uVar19 != uVar14);
        }
        lVar8 = (long)local_308.numcname;
        if (0 < lVar8) {
          lVar23 = 0;
          do {
            Curl_infof(data,"CNAME: %s\n",*(undefined8 *)((long)&local_308.cname[0].alloc + lVar23))
            ;
            lVar23 = lVar23 + 0x18;
          } while (lVar8 * 0x18 != lVar23);
        }
        if (local_308.numaddr < 1) {
          bVar24 = true;
          local_330 = (Curl_addrinfo *)0x0;
        }
        else {
          iVar2 = 0;
          uVar1 = (ushort)(data->req).doh.port;
          pcVar21 = (data->req).doh.host;
          paVar18 = &local_308.addr[0].ip;
          pCVar17 = (Curl_addrinfo *)0x0;
          local_330 = (Curl_addrinfo *)0x0;
          uVar19 = 1;
          do {
            iVar3 = ((dohaddr *)((long)paVar18 + -4))->type;
            cVar20 = 0x10;
            if (iVar3 == 0x1c) {
              cVar20 = 0x1c;
            }
            pCVar9 = (Curl_addrinfo *)(*Curl_ccalloc)(1,0x30);
            if (pCVar9 == (Curl_addrinfo *)0x0) {
LAB_001309b4:
              bVar24 = false;
              iVar2 = 0x1b;
            }
            else {
              pcVar13 = (*Curl_cstrdup)(pcVar21);
              pCVar9->ai_canonname = pcVar13;
              if (pcVar13 == (char *)0x0) {
                (*Curl_cfree)(pCVar9);
                goto LAB_001309b4;
              }
              psVar10 = (sockaddr *)(*Curl_ccalloc)(1,(size_t)cVar20);
              pCVar9->ai_addr = psVar10;
              if (psVar10 == (sockaddr *)0x0) {
                (*Curl_cfree)(pCVar9->ai_canonname);
                (*Curl_cfree)(pCVar9);
                goto LAB_001309b4;
              }
              if (local_330 == (Curl_addrinfo *)0x0) {
                local_330 = pCVar9;
              }
              if (pCVar17 != (Curl_addrinfo *)0x0) {
                pCVar17->ai_next = pCVar9;
              }
              iVar12 = (uint)(iVar3 == 0x1c) * 8 + 2;
              pCVar9->ai_family = iVar12;
              pCVar9->ai_socktype = 1;
              pCVar9->ai_addrlen = cVar20;
              if (iVar3 == 0x1c) {
                uVar4 = *(undefined8 *)((long)paVar18 + 8);
                *(undefined8 *)(psVar10->sa_data + 6) = *(undefined8 *)paVar18;
                psVar10[1].sa_family = (short)uVar4;
                psVar10[1].sa_data[0] = (char)((ulong)uVar4 >> 0x10);
                psVar10[1].sa_data[1] = (char)((ulong)uVar4 >> 0x18);
                psVar10[1].sa_data[2] = (char)((ulong)uVar4 >> 0x20);
                psVar10[1].sa_data[3] = (char)((ulong)uVar4 >> 0x28);
                psVar10[1].sa_data[4] = (char)((ulong)uVar4 >> 0x30);
                psVar10[1].sa_data[5] = (char)((ulong)uVar4 >> 0x38);
              }
              else {
                *(undefined4 *)(psVar10->sa_data + 2) = *(undefined4 *)paVar18;
              }
              psVar10->sa_family = (sa_family_t)iVar12;
              *(ushort *)psVar10->sa_data = uVar1 << 8 | uVar1 >> 8;
              bVar24 = true;
              pCVar17 = pCVar9;
            }
            if (!bVar24) break;
            paVar18 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar18 + 0x14);
            bVar24 = uVar19 < uVar14;
            uVar19 = uVar19 + 1;
          } while (bVar24);
          bVar24 = iVar2 == 0;
        }
        if (!bVar24) {
          Curl_freeaddrinfo(local_330);
          local_330 = (Curl_addrinfo *)0x0;
        }
        if (local_330 == (Curl_addrinfo *)0x0) {
          lVar8 = (long)local_308.numcname;
          CVar15 = CURLE_OUT_OF_MEMORY;
          if (0 < lVar8) {
            lVar23 = 0;
            do {
              (*Curl_cfree)(*(void **)((long)&local_308.cname[0].alloc + lVar23));
              lVar23 = lVar23 + 0x18;
            } while (lVar8 * 0x18 != lVar23);
          }
          bVar24 = false;
        }
        else {
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          pCVar11 = Curl_cache_addr(data,local_330,(data->req).doh.host,(data->req).doh.port);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          lVar8 = (long)local_308.numcname;
          if (0 < lVar8) {
            lVar23 = 0;
            do {
              (*Curl_cfree)(*(void **)((long)&local_308.cname[0].alloc + lVar23));
              lVar23 = lVar23 + 0x18;
            } while (lVar8 * 0x18 != lVar23);
          }
          if (pCVar11 == (Curl_dns_entry *)0x0) {
            Curl_freeaddrinfo(local_330);
            bVar24 = true;
            CVar15 = CURLE_OK;
          }
          else {
            (conn->async).dns = pCVar11;
            *dnsp = pCVar11;
            bVar24 = false;
            CVar15 = CURLE_OK;
          }
        }
        if (!bVar24) {
          return CVar15;
        }
      }
      CVar15 = CURLE_COULDNT_RESOLVE_HOST;
      if (0 < (long)local_308.numcname) {
        lVar8 = 0;
        do {
          (*Curl_cfree)(*(void **)((long)&local_308.cname[0].alloc + lVar8));
          lVar8 = lVar8 + 0x18;
        } while ((long)local_308.numcname * 0x18 != lVar8);
      }
    }
  }
  return CVar15;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct connectdata *conn,
                              struct Curl_dns_entry **dnsp)
{
  struct Curl_easy *data = conn->data;
  *dnsp = NULL; /* defaults to no response */

  if(!data->req.doh.probe[0].easy && !data->req.doh.probe[1].easy) {
    failf(data, "Could not DOH-resolve: %s", conn->async.hostname);
    return conn->bits.proxy?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!data->req.doh.pending) {
    DOHcode rc;
    DOHcode rc2;
    struct dohentry de;
    /* remove DOH handles from multi handle and close them */
    curl_multi_remove_handle(data->multi, data->req.doh.probe[0].easy);
    Curl_close(data->req.doh.probe[0].easy);
    curl_multi_remove_handle(data->multi, data->req.doh.probe[1].easy);
    Curl_close(data->req.doh.probe[1].easy);

    /* parse the responses, create the struct and return it! */
    init_dohentry(&de);
    rc = doh_decode(data->req.doh.probe[0].serverdoh.memory,
                    data->req.doh.probe[0].serverdoh.size,
                    data->req.doh.probe[0].dnstype,
                    &de);
    free(data->req.doh.probe[0].serverdoh.memory);
    if(rc) {
      infof(data, "DOH: %s type %s for %s\n", doh_strerror(rc),
            type2name(data->req.doh.probe[0].dnstype),
            data->req.doh.host);
    }
    rc2 = doh_decode(data->req.doh.probe[1].serverdoh.memory,
                     data->req.doh.probe[1].serverdoh.size,
                     data->req.doh.probe[1].dnstype,
                     &de);
    free(data->req.doh.probe[1].serverdoh.memory);
    if(rc2) {
      infof(data, "DOH: %s type %s for %s\n", doh_strerror(rc2),
            type2name(data->req.doh.probe[1].dnstype),
            data->req.doh.host);
    }
    if(!rc || !rc2) {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DOH Host name: %s\n", data->req.doh.host);
      showdoh(data, &de);

      ai = doh2ai(&de, data->req.doh.host, data->req.doh.port);
      if(!ai) {
        de_cleanup(&de);
        return CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, data->req.doh.host, data->req.doh.port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      de_cleanup(&de);
      if(!dns)
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      else {
        conn->async.dns = dns;
        *dnsp = dns;
        return CURLE_OK;
      }
    }
    de_cleanup(&de);

    return CURLE_COULDNT_RESOLVE_HOST;
  }

  return CURLE_OK;
}